

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O0

CURLcode ftp_cw_lc_write(Curl_easy *data,Curl_cwriter *writer,int type,char *buf,size_t blen)

{
  void *pvVar1;
  CURLcode CVar2;
  void *pvVar3;
  size_t nbytes;
  CURLcode result;
  size_t chunk_len;
  char *cp;
  int chunk_type;
  ftp_cw_lc_ctx *ctx;
  size_t blen_local;
  char *buf_local;
  int type_local;
  Curl_cwriter *writer_local;
  Curl_easy *data_local;
  
  pvVar1 = writer->ctx;
  if (((type & 1U) == 0) ||
     (ctx = (ftp_cw_lc_ctx *)blen, blen_local = (size_t)buf,
     (data->conn->proto).ftpc.transfertype != 'A')) {
    data_local._4_4_ = Curl_cwriter_write(data,writer->next,type,buf,blen);
  }
  else {
    while (ctx != (ftp_cw_lc_ctx *)0x0) {
      if ((*(byte *)((long)pvVar1 + 0x20) & 1) != 0) {
        if ((*(char *)blen_local != '\n') &&
           (CVar2 = Curl_cwriter_write(data,writer->next,type & 0xffffff7fU,"\nftps",1),
           CVar2 != CURLE_OK)) {
          return CVar2;
        }
        *(undefined1 *)((long)pvVar1 + 0x20) = 0;
      }
      pvVar3 = memchr((void *)blen_local,0xd,(size_t)ctx);
      if (pvVar3 == (void *)0x0) break;
      nbytes = (long)pvVar3 - blen_local;
      if ((nbytes != 0) &&
         (CVar2 = Curl_cwriter_write(data,writer->next,type & 0xffffff7fU,(char *)blen_local,nbytes)
         , CVar2 != CURLE_OK)) {
        return CVar2;
      }
      blen_local = (long)pvVar3 + 1;
      ctx = (ftp_cw_lc_ctx *)((long)ctx + (-1 - nbytes));
      *(undefined1 *)((long)pvVar1 + 0x20) = 1;
    }
    if (ctx == (ftp_cw_lc_ctx *)0x0) {
      if ((type & 0x80U) == 0) {
        data_local._4_4_ = CURLE_OK;
      }
      else if ((*(byte *)((long)pvVar1 + 0x20) & 1) == 0) {
        data_local._4_4_ = Curl_cwriter_write(data,writer->next,type,(char *)blen_local,0);
      }
      else {
        *(undefined1 *)((long)pvVar1 + 0x20) = 0;
        data_local._4_4_ = Curl_cwriter_write(data,writer->next,type,"\nftps",1);
      }
    }
    else {
      data_local._4_4_ = Curl_cwriter_write(data,writer->next,type,(char *)blen_local,(size_t)ctx);
    }
  }
  return data_local._4_4_;
}

Assistant:

static CURLcode ftp_cw_lc_write(struct Curl_easy *data,
                                struct Curl_cwriter *writer, int type,
                                const char *buf, size_t blen)
{
  static const char nl = '\n';
  struct ftp_cw_lc_ctx *ctx = writer->ctx;

  if(!(type & CLIENTWRITE_BODY) ||
     data->conn->proto.ftpc.transfertype != 'A')
    return Curl_cwriter_write(data, writer->next, type, buf, blen);

  /* ASCII mode BODY data, convert lineends */
  while(blen) {
    /* do not pass EOS when writing parts */
    int chunk_type = (type & ~CLIENTWRITE_EOS);
    const char *cp;
    size_t chunk_len;
    CURLcode result;

    if(ctx->newline_pending) {
      if(buf[0] != '\n') {
        /* previous chunk ended in '\r' and we do not see a '\n' in this one,
         * need to write a newline. */
        result = Curl_cwriter_write(data, writer->next, chunk_type, &nl, 1);
        if(result)
          return result;
      }
      /* either we just wrote the newline or it is part of the next
       * chunk of bytes we write. */
      ctx->newline_pending = FALSE;
    }

    cp = memchr(buf, '\r', blen);
    if(!cp)
      break;

    /* write the bytes before the '\r', excluding the '\r' */
    chunk_len = cp - buf;
    if(chunk_len) {
      result = Curl_cwriter_write(data, writer->next, chunk_type,
                                  buf, chunk_len);
      if(result)
        return result;
    }
    /* skip the '\r', we now have a newline pending */
    buf = cp + 1;
    blen = blen - chunk_len - 1;
    ctx->newline_pending = TRUE;
  }

  /* Any remaining data does not contain a '\r' */
  if(blen) {
    DEBUGASSERT(!ctx->newline_pending);
    return Curl_cwriter_write(data, writer->next, type, buf, blen);
  }
  else if(type & CLIENTWRITE_EOS) {
    /* EndOfStream, if we have a trailing cr, now is the time to write it */
    if(ctx->newline_pending) {
      ctx->newline_pending = FALSE;
      return Curl_cwriter_write(data, writer->next, type, &nl, 1);
    }
    /* Always pass on the EOS type indicator */
    return Curl_cwriter_write(data, writer->next, type, buf, 0);
  }
  return CURLE_OK;
}